

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  Node *n;
  bool bVar1;
  Node *pNVar2;
  ulong uVar3;
  
  uVar3 = (ulong)((this->max_height_).super___atomic_base<int>._M_i - 1);
  n = this->head_;
  do {
    pNVar2 = n;
    uVar3 = (ulong)(int)uVar3;
    while( true ) {
      n = pNVar2->next_[uVar3]._M_b._M_p;
      bVar1 = KeyIsAfterNode(this,key,n);
      if (bVar1) break;
      if (prev != (Node **)0x0) {
        prev[uVar3] = pNVar2;
      }
      if ((int)uVar3 == 0) {
        return n;
      }
      uVar3 = uVar3 - 1;
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}